

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

void __thiscall fasttext::Args::save(Args *this,ostream *out)

{
  std::ostream::write((char *)out,(long)&this->dim);
  std::ostream::write((char *)out,(long)&this->ws);
  std::ostream::write((char *)out,(long)&this->epoch);
  std::ostream::write((char *)out,(long)&this->minCount);
  std::ostream::write((char *)out,(long)&this->neg);
  std::ostream::write((char *)out,(long)&this->wordNgrams);
  std::ostream::write((char *)out,(long)&this->loss);
  std::ostream::write((char *)out,(long)&this->model);
  std::ostream::write((char *)out,(long)&this->bucket);
  std::ostream::write((char *)out,(long)&this->minn);
  std::ostream::write((char *)out,(long)&this->maxn);
  std::ostream::write((char *)out,(long)&this->lrUpdateRate);
  std::ostream::write((char *)out,(long)&this->t);
  return;
}

Assistant:

void Args::save(std::ostream& out) {
  out.write((char*)&(dim), sizeof(int));
  out.write((char*)&(ws), sizeof(int));
  out.write((char*)&(epoch), sizeof(int));
  out.write((char*)&(minCount), sizeof(int));
  out.write((char*)&(neg), sizeof(int));
  out.write((char*)&(wordNgrams), sizeof(int));
  out.write((char*)&(loss), sizeof(loss_name));
  out.write((char*)&(model), sizeof(model_name));
  out.write((char*)&(bucket), sizeof(int));
  out.write((char*)&(minn), sizeof(int));
  out.write((char*)&(maxn), sizeof(int));
  out.write((char*)&(lrUpdateRate), sizeof(int));
  out.write((char*)&(t), sizeof(double));
}